

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# support.c
# Opt level: O3

void fwrite32be(FILE *fp,uint32_t w)

{
  uint8_t be [4];
  undefined1 local_4 [4];
  
  fwritex(fp,local_4,4);
  return;
}

Assistant:

void fwrite32be(FILE *fp,uint32_t w)
/* write a big endian 32 bit word */
{
  uint8_t be[4];

  be[0] = (w>>24) & 0xff;
  be[1] = (w>>16) & 0xff;
  be[2] = (w>>8) & 0xff;
  be[3] = w & 0xff;
  fwritex(fp,be,4);
}